

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCall.cpp
# Opt level: O0

MockActualCall * __thiscall
MockActualCallTrace::withUnsignedLongIntParameter
          (MockActualCallTrace *this,SimpleString *name,unsigned_long value)

{
  SimpleString local_80 [2];
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  unsigned_long local_20;
  unsigned_long value_local;
  SimpleString *name_local;
  MockActualCallTrace *this_local;
  
  local_20 = value;
  value_local = (unsigned_long)name;
  name_local = (SimpleString *)this;
  addParameterName(this,name);
  ::StringFrom((unsigned_long)&local_50);
  SimpleString::SimpleString(&local_60," ");
  SimpleString::operator+(&local_40,&local_50);
  BracketsFormattedHexStringFrom((unsigned_long)local_80);
  SimpleString::operator+(&local_30,&local_40);
  SimpleString::operator+=(&this->traceBuffer_,&local_30);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(local_80);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  return &this->super_MockActualCall;
}

Assistant:

MockActualCall& MockActualCallTrace::withUnsignedLongIntParameter(const SimpleString& name, unsigned long int value)
{
    addParameterName(name);
    traceBuffer_ += StringFrom(value) + " " + BracketsFormattedHexStringFrom(value);
    return *this;
}